

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest3_4::inspectSubroutineBinding
          (FunctionalTest3_4 *this,GLuint program_id,GLchar **subroutine_names,
          GLchar **uniform_names,bool use_program_query)

{
  ostringstream *poVar1;
  int iVar2;
  deUint32 dVar3;
  GLuint GVar4;
  undefined4 extraout_var;
  MessageBuilder *pMVar6;
  GLchar **ppGVar7;
  bool bVar8;
  long lVar9;
  long lVar10;
  GLint n_active_subroutine_uniforms;
  GLuint queried_subroutine_index;
  GLint n_active_subroutines;
  vector<unsigned_int,_std::allocator<unsigned_int>_> subroutine_uniforms;
  int local_210;
  GLuint local_20c;
  GLuint local_208;
  uint local_204;
  FunctionalTest3_4 *local_200;
  long local_1f8;
  uint local_1f0;
  int local_1ec;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_1e8;
  GLchar **local_1d0;
  GLchar **local_1c8;
  ulong local_1c0;
  GLchar **local_1b8;
  undefined1 local_1b0 [8];
  ostream local_1a8;
  long lVar5;
  
  local_200 = this;
  local_1c8 = subroutine_names;
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  local_1ec = 0;
  local_210 = 0;
  local_1e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208 = 0;
  local_20c = program_id;
  (**(code **)(lVar5 + 0x9d0))(program_id,0x8b31,0x8de5);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"GetProgramStageiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0xe2f);
  (**(code **)(lVar5 + 0x9d0))(local_20c,0x8b31,0x8de6,&local_210);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"GetProgramStageiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0xe32);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1e8,(long)local_210);
  bVar8 = true;
  local_204 = (uint)use_program_query;
  lVar10 = 0;
  local_1d0 = uniform_names;
  while (ppGVar7 = local_1d0, lVar10 < local_210) {
    local_1f0 = getSubroutineUniformLocation
                          (local_200,local_20c,local_1d0[lVar10],SUB41(local_204,0));
    local_1b8 = ppGVar7 + lVar10;
    local_1c0 = (ulong)local_1f0;
    ppGVar7 = local_1c8;
    local_1f8 = lVar10;
    for (lVar9 = 0; lVar9 < local_1ec; lVar9 = lVar9 + 1) {
      GVar4 = getSubroutineIndex(local_200,local_20c,*ppGVar7,SUB41(local_204,0));
      local_1e8._M_impl.super__Vector_impl_data._M_start[local_1f8] = GVar4;
      (**(code **)(lVar5 + 0x1668))(0x8b31,local_210);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"UniformSubroutinesuiv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0xe41);
      (**(code **)(lVar5 + 0xb50))(0x8b31,local_1f0,&local_208);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"GetUniformSubroutineuiv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0xe44);
      if (local_208 != GVar4) {
        local_1b0 = (undefined1  [8])((local_200->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::operator<<(&local_1a8,"Error. Invalid result. Function: gl.getUniformSubroutineuiv.");
        std::operator<<(&local_1a8," Subroutine uniform: ");
        std::ostream::operator<<(&local_1a8,(int)local_1f8);
        std::operator<<(&local_1a8,", name: ");
        pMVar6 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,local_1b8);
        poVar1 = &pMVar6->m_str;
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", location: ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,". Subroutine: "
                       );
        std::ostream::operator<<(poVar1,(int)lVar9);
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", name: ");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,ppGVar7);
        poVar1 = &pMVar6->m_str;
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", index: ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,". Result: ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        bVar8 = false;
      }
      ppGVar7 = ppGVar7 + 1;
    }
    lVar10 = local_1f8 + 1;
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_1e8);
  return bVar8;
}

Assistant:

bool FunctionalTest3_4::inspectSubroutineBinding(GLuint program_id, const GLchar** subroutine_names,
												 const GLchar** uniform_names, bool use_program_query) const
{
	const glw::Functions& gl						   = m_context.getRenderContext().getFunctions();
	bool				  result					   = true;
	GLint				  n_active_subroutines		   = 0;
	GLint				  n_active_subroutine_uniforms = 0;
	std::vector<GLuint>   subroutine_uniforms;
	GLuint				  queried_subroutine_index = 0;

	gl.getProgramStageiv(program_id, GL_VERTEX_SHADER, GL_ACTIVE_SUBROUTINES, &n_active_subroutines);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramStageiv");

	gl.getProgramStageiv(program_id, GL_VERTEX_SHADER, GL_ACTIVE_SUBROUTINE_UNIFORMS, &n_active_subroutine_uniforms);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramStageiv");

	subroutine_uniforms.resize(n_active_subroutine_uniforms);

	for (GLint uniform = 0; uniform < n_active_subroutine_uniforms; ++uniform)
	{
		GLuint uniform_location = getSubroutineUniformLocation(program_id, uniform_names[uniform], use_program_query);

		for (GLint routine = 0; routine < n_active_subroutines; ++routine)
		{
			GLuint routine_index = getSubroutineIndex(program_id, subroutine_names[routine], use_program_query);

			subroutine_uniforms[uniform] = routine_index;

			gl.uniformSubroutinesuiv(GL_VERTEX_SHADER, n_active_subroutine_uniforms, &subroutine_uniforms[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "UniformSubroutinesuiv");

			gl.getUniformSubroutineuiv(GL_VERTEX_SHADER, uniform_location, &queried_subroutine_index);
			GLU_EXPECT_NO_ERROR(gl.getError(), "GetUniformSubroutineuiv");

			if (queried_subroutine_index != routine_index)
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Error. Invalid result. Function: gl.getUniformSubroutineuiv."
					<< " Subroutine uniform: " << uniform << ", name: " << uniform_names[uniform]
					<< ", location: " << uniform_location << ". Subroutine: " << routine
					<< ", name: " << subroutine_names[routine] << ", index: " << routine_index
					<< ". Result: " << queried_subroutine_index << tcu::TestLog::EndMessage;

				result = false;
			}
		}
	}

	return result;
}